

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

void __thiscall CVmObjFixup::fix_vmb_obj(CVmObjFixup *this,char *p)

{
  uint32_t tmp;
  vm_obj_id_t vVar1;
  
  vVar1 = get_new_id(this,*(vm_obj_id_t *)p);
  *(vm_obj_id_t *)p = vVar1;
  return;
}

Assistant:

void CVmObjFixup::fix_vmb_obj(VMG_ char *p)
{
    vm_obj_id_t id;

    /* get the old ID */
    id = vmb_get_objid(p);

    /* fix it up */
    id = get_new_id(vmg_ id);

    /* store it back */
    vmb_put_objid(p, id);
}